

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O1

int16 * ps_endpointer_process(ps_endpointer_t *ep,int16 *frame)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ps_vad_class_t pVar4;
  int16 *piVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  if ((ep != (ps_endpointer_t *)0x0) && (ep->vad != (ps_vad_t *)0x0)) {
    if ((ep->in_speech != 0) && (ep->n == ep->maxlen)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
              ,0x126,"VAD queue overflow (should not happen)");
    }
    pVar4 = ps_vad_classify(ep->vad,frame);
    lVar9 = (long)((ep->n + ep->pos) % ep->maxlen);
    memcpy(ep->buf + ep->frame_size * lVar9,frame,(long)ep->frame_size * 2);
    ep->is_speech[lVar9] = (int8)pVar4;
    uVar1 = ep->maxlen;
    if (ep->n == uVar1) {
      ep->qstart_time = ep->frame_length + ep->qstart_time;
      ep->pos = (ep->pos + 1) % (int)uVar1;
    }
    else {
      ep->n = ep->n + 1;
    }
    ep->timestamp = ep->frame_length + ep->timestamp;
    uVar2 = ep->n;
    iVar8 = 0;
    if (uVar2 != 0) {
      if (uVar2 == uVar1) {
        iVar8 = 0;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          iVar8 = 0;
          do {
            iVar8 = iVar8 + ep->is_speech[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
      }
      else {
        iVar3 = ep->pos;
        iVar8 = (int)ep->is_speech[iVar3];
        for (iVar7 = iVar3 + 1; iVar7 != (int)(uVar2 + iVar3) % (int)uVar1;
            iVar7 = (iVar7 + 1) % (int)uVar1) {
          iVar8 = iVar8 + ep->is_speech[iVar7];
        }
      }
    }
    if (ep->in_speech == 0) {
      if (ep->start_frames < iVar8) {
        ep->speech_start = ep->qstart_time;
        ep->speech_end = 0.0;
        ep->in_speech = 1;
      }
    }
    else if (iVar8 < ep->end_frames) {
      piVar5 = ep_pop(ep,(int *)0x0);
      ep->speech_end = ep->qstart_time;
      ep->in_speech = 0;
      return piVar5;
    }
    if (ep->in_speech != 0) {
      piVar5 = ep_pop(ep,(int *)0x0);
      return piVar5;
    }
  }
  return (int16 *)0x0;
}

Assistant:

const int16 *
ps_endpointer_process(ps_endpointer_t *ep,
                      const int16 *frame)
{
    int is_speech, speech_count;
    if (ep == NULL || ep->vad == NULL)
        return NULL;
    if (ep->in_speech && ep_full(ep)) {
        E_ERROR("VAD queue overflow (should not happen)");
        /* Not fatal, we just lose data. */
    }
    is_speech = ps_vad_classify(ep->vad, frame);
    ep_push(ep, is_speech, frame);
    ep->timestamp += ep->frame_length;
    speech_count = ep_speech_count(ep);
    E_DEBUG("%.2f %d %d %d\n", ep->timestamp, speech_count,
            ep->start_frames, ep->end_frames);
    if (ep->in_speech) {
        if (speech_count < ep->end_frames) {
            /* Return only the first frame.  Either way it's sort of
               arbitrary, but this avoids having to drain the queue to
               prevent overlapping segments.  It's also closer to what
               human annotators will do. */
            int16 *pcm = ep_pop(ep, NULL);
            ep->speech_end = ep->qstart_time;
            ep->in_speech = FALSE;
            return pcm;
        }
    }
    else {
        if (speech_count > ep->start_frames) {
            ep->speech_start = ep->qstart_time;
            ep->speech_end = 0;
            ep->in_speech = TRUE;
        }
    }
    if (ep->in_speech)
        return ep_pop(ep, NULL);
    else
        return NULL;
}